

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void emit_restart(j_compress_ptr cinfo,int restart_num)

{
  jpeg_entropy_encoder *pjVar1;
  jpeg_component_info *pjVar2;
  jpeg_component_info *compptr;
  int ci;
  arith_entropy_ptr entropy;
  int restart_num_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->entropy;
  finish_pass(cinfo);
  emit_byte(0xff,cinfo);
  emit_byte(restart_num + 0xd0,cinfo);
  for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->comps_in_scan; compptr._4_4_ = compptr._4_4_ + 1) {
    pjVar2 = cinfo->cur_comp_info[compptr._4_4_];
    if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
      memset((&pjVar1[4].encode_mcu)[pjVar2->dc_tbl_no],0,0x40);
      *(undefined4 *)((long)&pjVar1[2].finish_pass + (long)compptr._4_4_ * 4) = 0;
      *(undefined4 *)((long)&pjVar1[3].encode_mcu + (long)compptr._4_4_ * 4) = 0;
    }
    if (cinfo->Se != 0) {
      memset((&pjVar1[9].finish_pass)[pjVar2->ac_tbl_no],0,0x100);
    }
  }
  pjVar1[1].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  pjVar1[1].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x10000;
  pjVar1[1].finish_pass = (_func_void_j_compress_ptr *)0x0;
  pjVar1[2].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  *(undefined4 *)&pjVar1[2].encode_mcu = 0xb;
  *(undefined4 *)((long)&pjVar1[2].encode_mcu + 4) = 0xffffffff;
  return;
}

Assistant:

LOCAL(void)
emit_restart (j_compress_ptr cinfo, int restart_num)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci;
  jpeg_component_info * compptr;

  finish_pass(cinfo);

  emit_byte(0xFF, cinfo);
  emit_byte(JPEG_RST0 + restart_num, cinfo);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->Se) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */
}